

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_copy_wcs(archive_mstring *aes,wchar_t *wcs)

{
  wchar_t wVar1;
  undefined8 local_30;
  wchar_t *wcs_local;
  archive_mstring *aes_local;
  
  if (wcs == (wchar_t *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = wcslen(wcs);
  }
  wVar1 = archive_mstring_copy_wcs_len(aes,wcs,local_30);
  return wVar1;
}

Assistant:

int
archive_mstring_copy_wcs(struct archive_mstring *aes, const wchar_t *wcs)
{
	return archive_mstring_copy_wcs_len(aes, wcs,
				wcs == NULL ? 0 : wcslen(wcs));
}